

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  TTD_PTR_ID *pTVar1;
  TTD_PTR_ID TVar2;
  uint uVar3;
  ScriptContext *pSVar4;
  Var resolve;
  Var argument;
  JavascriptGenerator *generator;
  JavascriptAsyncSpawnStepFunction *pJVar5;
  Var local_38;
  
  pSVar4 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != JavascriptAsyncSpawnStepFunction) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  pTVar1 = (TTD_PTR_ID *)snpObject->AddtlSnapObjectInfo;
  if ((TTDVar)pTVar1[1] == (TTDVar)0x0) {
    local_38 = (Var)0x0;
  }
  else {
    local_38 = InflateMap::InflateTTDVar(inflator,(TTDVar)pTVar1[1]);
  }
  if ((TTDVar)pTVar1[2] == (TTDVar)0x0) {
    resolve = (Var)0x0;
  }
  else {
    resolve = InflateMap::InflateTTDVar(inflator,(TTDVar)pTVar1[2]);
  }
  if ((TTDVar)pTVar1[4] == (TTDVar)0x0) {
    argument = (Var)0x0;
  }
  else {
    argument = InflateMap::InflateTTDVar(inflator,(TTDVar)pTVar1[4]);
  }
  TVar2 = pTVar1[3];
  if (*pTVar1 == 0) {
    generator = (JavascriptGenerator *)0x0;
  }
  else {
    generator = (JavascriptGenerator *)InflateMap::LookupObject(inflator,*pTVar1);
  }
  uVar3 = (int)pTVar1[5] - 1;
  if (uVar3 < 3) {
    pJVar5 = Js::JavascriptLibrary::CreateAsyncSpawnStepFunction
                       ((pSVar4->super_ScriptContextBase).javascriptLibrary,
                        (JavascriptMethod)(&PTR_EntryAsyncSpawnStepNextFunction_014fc480)[uVar3],
                        generator,argument,resolve,local_38,SUB81(TVar2,0));
    return (RecyclableObject *)pJVar5;
  }
  TTDAbort_unrecoverable_error
            ("Unexpected value for entryPoint when inflating JavascriptAsyncSpawnStepFunction");
}

Assistant:

Js::RecyclableObject *DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext *ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapJavascriptAsyncSpawnStepFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapJavascriptAsyncSpawnStepFunctionInfo *, SnapObjectType::JavascriptAsyncSpawnStepFunction>(snpObject);
            Js::Var reject = (info->reject != nullptr) ? inflator->InflateTTDVar(info->reject) : nullptr;
            Js::Var resolve = (info->resolve != nullptr) ? inflator->InflateTTDVar(info->resolve) : nullptr;
            Js::Var argument = (info->argument != nullptr) ? inflator->InflateTTDVar(info->argument) : nullptr;
            bool isReject = info->isReject;

            Js::JavascriptGenerator* generator = nullptr;
            if (info->generator != TTD_INVALID_PTR_ID)
            {
                generator = reinterpret_cast<Js::JavascriptGenerator*>(inflator->LookupObject(info->generator));
            }

            Js::JavascriptMethod entryPoint = nullptr;
            switch (info->entryPoint)
            {
            case 1:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepNextFunction;
                break;
            case 2:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepThrowFunction;
                break;
            case 3:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnCallStepFunction;
                break;
            default:
                TTDAssert(false, "Unexpected value for entryPoint when inflating JavascriptAsyncSpawnStepFunction");
                break;
            }

            return ctx->GetLibrary()->CreateAsyncSpawnStepFunction(entryPoint, generator, argument, resolve, reject, isReject);
        }